

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb_thrdpool.c
# Opt level: O0

void uo_cb_thrdpool_quit(void)

{
  uo_cb *cb;
  ulong local_18;
  size_t i_1;
  size_t i;
  
  is_quitting = true;
  uo_cb_thrd_init();
  sem_post((sem_t *)&thrdpool.update_sem);
  pthread_join(thrdpool.manager_thrd,(void **)0x0);
  for (i_1 = 0; i_1 < thrdpool.thrd_count; i_1 = i_1 + 1) {
    cb = uo_cb_create();
    uo_cb_invoke_async(cb);
  }
  for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
    if (thrdpool.cb_thrds[local_18].state != UO_CB_THRD_UNINITIALIZED) {
      pthread_join(thrdpool.cb_thrds[local_18].thrd,(void **)0x0);
    }
  }
  sem_destroy((sem_t *)&thrdpool.update_sem);
  uo_cb_thrd_quit();
  is_init = false;
  return;
}

Assistant:

static void uo_cb_thrdpool_quit(void)
{
    is_quitting = true;

    uo_cb_thrd_init();
    sem_post(&thrdpool.update_sem);

    pthread_join(thrdpool.manager_thrd, NULL);

    for (size_t i = 0; i < thrdpool.thrd_count; ++i)
        uo_cb_invoke_async(uo_cb_create());

    for (size_t i = 0; i < UO_CB_THRD_COUNT_MAX; ++i)
        if (thrdpool.cb_thrds[i].state)
            pthread_join(thrdpool.cb_thrds[i].thrd, NULL);

    sem_destroy(&thrdpool.update_sem);
    uo_cb_thrd_quit();

    is_init = false;
}